

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_help.c
# Opt level: O3

void cfg_help_acl(autobuf *out,_Bool preamble,_Bool prefix,int8_t *af_types,size_t af_types_count)

{
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,preamble) != 0) {
    abuf_puts(out,
              "    Parameter is an apache2 style access control list made from a list of network addresses of the following types:\n"
             );
  }
  cfg_help_netaddr(out,false,prefix,af_types,af_types_count);
  abuf_puts(out,
            "        Each of the addresses/prefixes can start with a \'+\' to add them to the whitelist and \'-\' to add it to the blacklist (default is the whitelist).\n        In addition to this there are four keywords to configure the ACL:\n        - \'first_accept\' to parse the whitelist first\n        - \'first_reject\' to parse the blacklist first\n        - \'default_accept\' to accept input if it doesn\'t match either list\n        - \'default_reject\' to not accept it if it doesn\'t match either list\n        (default mode is \'first_accept\' and \'default_reject\')\n"
           );
  return;
}

Assistant:

void
cfg_help_acl(struct autobuf *out, bool preamble, bool prefix, const int8_t *af_types, size_t af_types_count) {
  if (preamble) {
    abuf_puts(out, CFG_HELP_INDENT_PREFIX "Parameter is an apache2 style access control list made from a list of "
                                          "network addresses of the following types:\n");
  }

  cfg_help_netaddr(out, false, prefix, af_types, af_types_count);

  abuf_puts(out, CFG_HELP_INDENT_PREFIX
    "    Each of the addresses/prefixes can start with a"
    " '+' to add them to the whitelist and '-' to add it to the blacklist"
    " (default is the whitelist).\n" CFG_HELP_INDENT_PREFIX
    "    In addition to this there are four keywords to configure the ACL:\n" CFG_HELP_INDENT_PREFIX
    "    - '" ACL_FIRST_ACCEPT "' to parse the whitelist first\n" CFG_HELP_INDENT_PREFIX "    - '" ACL_FIRST_REJECT
    "' to parse the blacklist first\n" CFG_HELP_INDENT_PREFIX "    - '" ACL_DEFAULT_ACCEPT
    "' to accept input if it doesn't match either list\n" CFG_HELP_INDENT_PREFIX "    - '" ACL_DEFAULT_REJECT
    "' to not accept it if it doesn't match either list\n" CFG_HELP_INDENT_PREFIX
    "    (default mode is '" ACL_FIRST_ACCEPT "' and '" ACL_DEFAULT_REJECT "')\n");
}